

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_list_insertsort(QcList *list,QC_LIST_COMPAREFUNC CompareFunc)

{
  QcListEntry *pQVar1;
  int iVar2;
  QcListEntry *cur_entry;
  QcListEntry *temp_entry;
  QcListEntry *prev_entry;
  QcListEntry *entry;
  QC_LIST_COMPAREFUNC CompareFunc_local;
  QcList *list_local;
  
  prev_entry = list->head;
  if (prev_entry == (QcListEntry *)0x0) {
    list_local._4_4_ = 0;
  }
  else {
    while (prev_entry->next != (QcListEntry *)0x0) {
      cur_entry = list->head;
      temp_entry = (QcListEntry *)0x0;
      for (; cur_entry != prev_entry->next; cur_entry = cur_entry->next) {
        iVar2 = (*CompareFunc)(prev_entry->next->data,cur_entry->data);
        if (iVar2 < 0) {
          pQVar1 = prev_entry->next;
          prev_entry->next = prev_entry->next->next;
          if (prev_entry->next != (QcListEntry *)0x0) {
            prev_entry->next->prev = prev_entry;
          }
          if (temp_entry == (QcListEntry *)0x0) {
            pQVar1->next = cur_entry;
            pQVar1->prev = (QcListEntry *)0x0;
            list->head->prev = pQVar1;
            list->head = pQVar1;
          }
          else {
            temp_entry->next = pQVar1;
            pQVar1->prev = temp_entry;
            pQVar1->next = cur_entry;
            cur_entry->prev = pQVar1;
          }
          if (pQVar1 == list->tail) {
            list->tail = prev_entry;
          }
          break;
        }
        temp_entry = cur_entry;
      }
      if (cur_entry == prev_entry->next) {
        prev_entry = prev_entry->next;
      }
    }
    list_local._4_4_ = 1;
  }
  return list_local._4_4_;
}

Assistant:

int qc_list_insertsort(QcList *list, QC_LIST_COMPAREFUNC CompareFunc)
{
    QcListEntry *entry;
    QcListEntry *prev_entry;

    entry = list->head;
    prev_entry = NULL;

    if(NULL == entry)
    {
        return 0;
    }

    while(entry->next)
    {
        QcListEntry *temp_entry;

        temp_entry = list->head;
        prev_entry = NULL;
        while(temp_entry != entry->next)
        {
            if((*CompareFunc)(entry->next->data, temp_entry->data) < 0)
            {
                QcListEntry *cur_entry = entry->next;

                entry->next = entry->next->next;
                if(entry->next)
                {
                    entry->next->prev = entry;
                }

                if(prev_entry)
                {
                    prev_entry->next = cur_entry;
                    cur_entry->prev = prev_entry;

                    cur_entry->next = temp_entry;
                    temp_entry->prev = cur_entry;
                }
                else
                {
                    cur_entry->next = temp_entry;
                    cur_entry->prev = NULL;
                    list->head->prev = cur_entry;
                    list->head = cur_entry;
                }

                if(cur_entry == list->tail)
                {
                    list->tail = entry;
                }

                break;
            }

            prev_entry = temp_entry;
            temp_entry = temp_entry->next;
        } /* while ( temp_entry != entry->next ) */

        if(temp_entry == entry->next)
        {
            entry = entry->next;
        }
        else
        {
            /**/
        }
    } /* while ( entry->next != NULL ) */

    return 1;
}